

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.cc
# Opt level: O3

Range * __thiscall re2c::Enc::encodeRange(Enc *this,uint32_t l,uint32_t h)

{
  type_t tVar1;
  ulong uVar2;
  Range *pRVar3;
  Range *pRVar4;
  Range *r2;
  uint uVar5;
  
  tVar1 = this->type_;
  uVar2 = (ulong)tVar1;
  uVar5 = 0x110000;
  if (uVar2 < 3) {
    uVar5 = *(uint *)(&DAT_0014b250 + uVar2 * 4);
  }
  if (l < uVar5) {
    uVar5 = 0x110000;
    if (tVar1 < UTF16) {
      uVar5 = *(uint *)(&DAT_0014b250 + uVar2 * 4);
    }
    if (h < uVar5) {
      if (tVar1 - UCS2 < 4) {
        pRVar3 = Range::ran(l,h + 1);
        if (h < 0xd800 || 0xdfff < l) {
          return pRVar3;
        }
        if (this->policy_ == POLICY_SUBSTITUTE) {
          pRVar4 = Range::ran(0xd800,0xe000);
          r2 = Range::sym(0xfffd);
          pRVar3 = Range::sub(pRVar3,pRVar4);
          pRVar3 = Range::add(pRVar3,r2);
          return pRVar3;
        }
        if (this->policy_ != POLICY_FAIL) {
          return pRVar3;
        }
      }
      else {
        if (tVar1 == EBCDIC) {
          pRVar3 = Range::sym(*(uint32_t *)(asc2ebc + (ulong)l * 4));
          if (h <= l) {
            return pRVar3;
          }
          uVar5 = l + 1;
          do {
            pRVar4 = Range::sym(*(uint32_t *)(asc2ebc + (ulong)uVar5 * 4));
            pRVar3 = Range::add(pRVar3,pRVar4);
            uVar5 = uVar5 + 1;
          } while (uVar5 <= h);
          return pRVar3;
        }
        if (tVar1 == ASCII) {
          pRVar3 = Range::ran(l,h + 1);
          return pRVar3;
        }
      }
    }
  }
  return (Range *)0x0;
}

Assistant:

Range * Enc::encodeRange(uint32_t l, uint32_t h) const
{
	if (l >= nCodePoints () || h >= nCodePoints ())
	{
		return NULL;
	}

	Range * r = NULL;
	switch (type_)
	{
		case ASCII:
			r = Range::ran (l, h + 1);
			break;
		case EBCDIC:
		{
			const uint32_t el = asc2ebc[l];
			r = Range::sym (el);
			for (uint32_t c = l + 1; c <= h; ++c)
			{
				const uint32_t ec = asc2ebc[c];
				r = Range::add (r, Range::sym (ec));
			}
			break;
		}
		case UCS2:
		case UTF16:
		case UTF32:
		case UTF8:
			r = Range::ran (l, h + 1);
			if (l <= SURR_MAX && h >= SURR_MIN)
			{
				switch (policy_)
				{
					case POLICY_FAIL:
						r = NULL;
						break;
					case POLICY_SUBSTITUTE:
					{
						Range * surrs = Range::ran (SURR_MIN, SURR_MAX + 1);
						Range * error = Range::sym (UNICODE_ERROR);
						r = Range::sub (r, surrs);
						r = Range::add (r, error);
						break;
					}
					case POLICY_IGNORE:
						break;
				}
			}
			break;
	}
	return r;
}